

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadCastServer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ostream *poVar6;
  size_t sVar7;
  __int_type _Var8;
  long lVar9;
  duration<long,_std::ratio<1L,_1000L>_> local_120;
  long local_118;
  rep msDiff;
  duration<long,_std::ratio<1L,_1L>_> local_108;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_100;
  duration<long,_std::ratio<1L,_1000000000L>_> local_f8;
  type diff;
  time_point now;
  anon_class_32_2_08c56cc0 local_c8;
  function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
  local_a8;
  allocator<char> local_81;
  string local_80 [48];
  undefined1 local_50 [8];
  PTR listenThrean;
  shared_ptr<brynet::net::EventLoop> mainLoop;
  int port;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    iVar2 = atoi(argv[1]);
    brynet::net::base::InitSocket();
    __r = &mainLoop.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    std::make_shared<brynet::net::WrapTcpService>();
    std::shared_ptr<brynet::net::WrapTcpService>::operator=
              (&service,(shared_ptr<brynet::net::WrapTcpService> *)__r);
    std::shared_ptr<brynet::net::WrapTcpService>::~shared_ptr
              ((shared_ptr<brynet::net::WrapTcpService> *)__r);
    std::make_shared<brynet::net::EventLoop>();
    brynet::net::ListenThread::Create();
    peVar3 = std::
             __shared_ptr_access<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"0.0.0.0",&local_81);
    std::shared_ptr<brynet::net::EventLoop>::shared_ptr
              (&local_c8.mainLoop,
               (shared_ptr<brynet::net::EventLoop> *)
               &listenThrean.
                super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<brynet::net::ListenThread>::shared_ptr
              (&local_c8.listenThrean,(shared_ptr<brynet::net::ListenThread> *)local_50);
    std::
    function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>
    ::function<main::__0,void>
              ((function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>
                *)&local_a8,&local_c8);
    brynet::net::ListenThread::startListen(peVar3,0,local_80,iVar2,&local_a8);
    std::
    function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
    ::~function(&local_a8);
    main::$_0::~__0((__0 *)&local_c8);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    peVar4 = std::
             __shared_ptr_access<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&service);
    std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
              ((function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)&now,
               (nullptr_t)0x0);
    brynet::net::WrapTcpService::startWorkThread
              (peVar4,2,(function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)&now);
    std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::~function
              ((function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)&now);
    diff.__r = std::chrono::_V2::steady_clock::now();
    do {
      do {
        peVar5 = std::
                 __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&listenThrean.
                                  super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        brynet::net::EventLoop::loop((long)peVar5);
        local_100.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        local_f8.__r = (rep)std::chrono::operator-
                                      (&local_100,
                                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&diff);
        msDiff._4_4_ = 1;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_108,(int *)((long)&msDiff + 4));
        bVar1 = std::chrono::operator>=(&local_f8,&local_108);
      } while (!bVar1);
      local_120.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_f8);
      local_118 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_120);
      poVar6 = std::operator<<((ostream *)&std::cout,"cost ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_118);
      poVar6 = std::operator<<(poVar6," ms, clientnum:");
      sVar7 = getClientNum();
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
      poVar6 = std::operator<<(poVar6,", recv");
      _Var8 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&TotalRecvLen);
      if (_Var8 < 0) {
        _Var8 = _Var8 + 0x3ff;
      }
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,((_Var8 >> 10) * 1000) / local_118);
      poVar6 = std::operator<<(poVar6," K/s, ");
      poVar6 = std::operator<<(poVar6,"num : ");
      _Var8 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&RecvPacketNum);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(_Var8 * 1000) / local_118);
      poVar6 = std::operator<<(poVar6,", send ");
      _Var8 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&TotalSendLen);
      if (_Var8 < 0) {
        _Var8 = _Var8 + 0x3ff;
      }
      lVar9 = _Var8 >> 10;
      if (lVar9 < 0) {
        lVar9 = lVar9 + 0x3ff;
      }
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,((lVar9 >> 10) * 1000) / local_118);
      poVar6 = std::operator<<(poVar6," M/s, ");
      poVar6 = std::operator<<(poVar6," num: ");
      _Var8 = std::__atomic_base::operator_cast_to_long_long((__atomic_base *)&SendPacketNum);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(_Var8 * 1000) / local_118);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__atomic_base<long_long>::operator=(&TotalRecvLen.super___atomic_base<long_long>,0);
      std::__atomic_base<long_long>::operator=(&TotalSendLen.super___atomic_base<long_long>,0);
      std::__atomic_base<long_long>::operator=(&RecvPacketNum.super___atomic_base<long_long>,0);
      std::__atomic_base<long_long>::operator=(&SendPacketNum.super___atomic_base<long_long>,0);
      diff.__r = std::chrono::_V2::steady_clock::now();
    } while( true );
  }
  fprintf(_stderr,"Usage : <listen port> \n");
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage : <listen port> \n");
        exit(-1);
    }

    int port = atoi(argv[1]);
    brynet::net::base::InitSocket();

    service = std::make_shared<WrapTcpService>();
    auto mainLoop = std::make_shared<EventLoop>();
    auto listenThrean = ListenThread::Create();

    listenThrean->startListen(false, "0.0.0.0", port, [mainLoop, listenThrean](TcpSocket::PTR socket) {
        socket->SocketNodelay();
        socket->SetSendSize(32 * 1024);
        socket->SetRecvSize(32 * 1024);

        auto enterCallback = [mainLoop](const TCPSession::PTR& session) {
            mainLoop->pushAsyncProc([session]() {
                addClientID(session);
            });

            session->setDisConnectCallback([mainLoop](const TCPSession::PTR& session) {
                mainLoop->pushAsyncProc([session]() {
                    removeClientID(session);
                });
            });

            session->setDataCallback([mainLoop](const TCPSession::PTR& session, const char* buffer, size_t len) {
                const char* parseStr = buffer;
                size_t totalProcLen = 0;
                size_t leftLen = len;

                while (true)
                {
                    bool flag = false;
                    auto HEAD_LEN = sizeof(uint32_t) + sizeof(uint16_t);
                    if (leftLen >= HEAD_LEN)
                    {
                        BasePacketReader rp(parseStr, leftLen);
                        auto packet_len = rp.readUINT32();
                        if (leftLen >= packet_len && packet_len >= HEAD_LEN)
                        {
                            auto packet = DataSocket::makePacket(parseStr, packet_len);
                            mainLoop->pushAsyncProc([packet]() {
                                broadCastPacket(packet);
                            });

                            totalProcLen += packet_len;
                            parseStr += packet_len;
                            leftLen -= packet_len;
                            flag = true;
                        }
                        rp.skipAll();
                    }

                    if (!flag)
                    {
                        break;
                    }
                }

                return totalProcLen;
            });
        };
        service->addSession(std::move(socket),
            AddSessionOption::WithEnterCallback(enterCallback),
            AddSessionOption::WithMaxRecvBufferSize(1024 * 1024));
    });

    service->startWorkThread(2);

    auto now = std::chrono::steady_clock::now();
    while (true)
    {
        mainLoop->loop(10);
        auto diff = std::chrono::steady_clock::now() - now;
        if (diff >= std::chrono::seconds(1))
        {
            auto msDiff = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "cost " << 
                msDiff << " ms, clientnum:" << 
                getClientNum() << ", recv" <<
                (TotalRecvLen / 1024) * 1000 / msDiff  << 
                " K/s, " << "num : " << 
                RecvPacketNum * 1000 / msDiff << ", send " <<
                (TotalSendLen / 1024) / 1024 * 1000 / msDiff <<
                " M/s, " << " num: " << 
                SendPacketNum * 1000 / msDiff << std::endl;
            TotalRecvLen = 0;
            TotalSendLen = 0;
            RecvPacketNum = 0;
            SendPacketNum = 0;
            now = std::chrono::steady_clock::now();
        }
    }

    service->stopWorkThread();

    return 0;
}